

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Cluster.cpp
# Opt level: O0

void __thiscall amrex::ClusterList::new_chop(ClusterList *this,Real eff)

{
  bool bVar1;
  iterator this_00;
  Cluster *__x;
  Cluster *in_RDI;
  double in_XMM0_Qa;
  Real RVar2;
  iterator cli;
  Cluster *in_stack_00000138;
  list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *in_stack_ffffffffffffffc8;
  _Self local_18;
  double local_10;
  
  local_10 = in_XMM0_Qa;
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>::begin
                 (in_stack_ffffffffffffffc8);
  while( true ) {
    this_00 = std::__cxx11::list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>::end
                        (in_stack_ffffffffffffffc8);
    bVar1 = std::operator!=(&local_18,(_Self *)&stack0xffffffffffffffe0);
    if (!bVar1) break;
    std::_List_iterator<amrex::Cluster_*>::operator*((_List_iterator<amrex::Cluster_*> *)0x18e1871);
    RVar2 = Cluster::eff(in_RDI);
    if (local_10 <= RVar2) {
      std::_List_iterator<amrex::Cluster_*>::operator++(&local_18);
    }
    else {
      std::_List_iterator<amrex::Cluster_*>::operator*
                ((_List_iterator<amrex::Cluster_*> *)0x18e1892);
      __x = Cluster::new_chop(in_stack_00000138);
      std::__cxx11::list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>::push_back
                ((list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *)this_00._M_node,
                 (value_type *)__x);
    }
  }
  return;
}

Assistant:

void
ClusterList::new_chop (Real eff)
{
    BL_PROFILE("ClusterList::new_chop()");

    for (std::list<Cluster*>::iterator cli = lst.begin(); cli != lst.end(); )
    {
        if ((*cli)->eff() < eff)
        {
            lst.push_back((*cli)->new_chop());
        }
        else
        {
            ++cli;
        }
    }
}